

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O2

void Fra_OneHotAddKnownConstraint(Fra_Man_t *p,Vec_Ptr_t *vOnehots)

{
  int i;
  int iVar1;
  Vec_Int_t *p_00;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int i_00;
  int i_01;
  int i_02;
  int pLits [2];
  int local_40;
  int local_3c;
  Vec_Ptr_t *local_38;
  
  i_00 = 0;
  local_38 = vOnehots;
  do {
    if (local_38->nSize <= i_00) {
      return;
    }
    p_00 = (Vec_Int_t *)Vec_PtrEntry(local_38,i_00);
    iVar1 = p_00->nSize;
    i_01 = 0;
    while (i_01 < iVar1) {
      i = Vec_IntEntry(p_00,i_01);
      i_01 = i_01 + 1;
      i_02 = i_01;
      while (iVar1 = p_00->nSize, i_02 < iVar1) {
        iVar1 = Vec_IntEntry(p_00,i_02);
        pAVar2 = Aig_ManCi(p->pManFraig,i);
        pAVar3 = Aig_ManCi(p->pManFraig,iVar1);
        local_40 = *(int *)(*(long *)((long)(pAVar2->field_5).pData + 0x98) + (long)pAVar2->Id * 4)
                   * 2 + 1;
        local_3c = *(int *)(*(long *)((long)(pAVar3->field_5).pData + 0x98) + (long)pAVar3->Id * 4)
                   * 2 + 1;
        iVar1 = sat_solver_addclause(p->pSat,&local_40,(lit *)&local_38);
        i_02 = i_02 + 1;
        if (iVar1 == 0) {
          puts("Fra_OneHotAddKnownConstraint(): Adding clause makes SAT solver unsat.");
          sat_solver_delete(p->pSat);
          p->pSat = (sat_solver *)0x0;
          return;
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

void Fra_OneHotAddKnownConstraint( Fra_Man_t * p, Vec_Ptr_t * vOnehots )
{
    Vec_Int_t * vGroup;
    Aig_Obj_t * pObj1, * pObj2;
    int k, i, j, Out1, Out2, pLits[2];
    //
    // these constrants should be added to different timeframes!
    // (also note that PIs follow first - then registers)
    //
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vGroup, k )
    {
        Vec_IntForEachEntry( vGroup, Out1, i )
        Vec_IntForEachEntryStart( vGroup, Out2, j, i+1 )
        {
            pObj1 = Aig_ManCi( p->pManFraig, Out1 );
            pObj2 = Aig_ManCi( p->pManFraig, Out2 );
            pLits[0] = toLitCond( Fra_ObjSatNum(pObj1), 1 );
            pLits[1] = toLitCond( Fra_ObjSatNum(pObj2), 1 );
            // add constraint to solver
            if ( !sat_solver_addclause( p->pSat, pLits, pLits + 2 ) )
            {
                printf( "Fra_OneHotAddKnownConstraint(): Adding clause makes SAT solver unsat.\n" );
                sat_solver_delete( p->pSat );
                p->pSat = NULL;
                return;
            }
        }
    }
}